

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::makeConst<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          Type type)

{
  _Storage<int,_true> _Var1;
  ParseDeclsCtx *pPVar2;
  bool bVar3;
  BasicType BVar4;
  uint32_t *puVar5;
  uint64_t *puVar6;
  float *pfVar7;
  double *pdVar8;
  optional<long> oVar9;
  optional<double> oVar10;
  allocator<char> local_1d9;
  string local_1d8;
  Err local_1b8;
  allocator<char> local_191;
  string local_190;
  Err local_170;
  Ok local_149;
  _Storage<double,_true> local_148;
  optional<double> c_3;
  string local_130;
  Err local_110;
  Ok local_ed;
  _Optional_payload_base<float> local_ec;
  optional<float> c_2;
  Err local_c0;
  Ok local_99;
  _Storage<long,_true> local_98;
  optional<long> c_1;
  allocator<char> local_71;
  string local_70;
  Err local_50;
  Ok local_2d;
  _Optional_payload_base<int> local_2c;
  optional<int> c;
  Index pos_local;
  ParseDeclsCtx *ctx_local;
  Type type_local;
  
  c.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._M_payload =
       (_Storage<int,_true>)pos;
  unique0x10000817 = ctx;
  ctx_local = (ParseDeclsCtx *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  bVar3 = wasm::Type::isBasic((Type *)&ctx_local);
  if (!bVar3) {
    __assert_fail("type.isBasic()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wat-parser.cpp"
                  ,0xc1a,
                  "Result<typename Ctx::InstrT> wasm::WATParser::(anonymous namespace)::makeConst(Ctx &, Index, Type) [Ctx = wasm::WATParser::(anonymous namespace)::ParseDeclsCtx]"
                 );
  }
  BVar4 = wasm::Type::getBasic((Type *)&ctx_local);
  pPVar2 = stack0xffffffffffffffe0;
  switch(BVar4) {
  case none:
  case unreachable:
  default:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wat-parser.cpp"
                       ,0xc36);
  case i32:
    local_2c = (_Optional_payload_base<int>)ParseInput::takeI32(&stack0xffffffffffffffe0->in);
    bVar3 = std::optional::operator_cast_to_bool((optional *)&local_2c);
    pPVar2 = stack0xffffffffffffffe0;
    _Var1 = c.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
            _M_payload;
    if (bVar3) {
      puVar5 = (uint32_t *)std::optional<int>::operator*((optional<int> *)&local_2c);
      NullInstrParserCtx::makeI32Const((NullInstrParserCtx *)pPVar2,_Var1._M_value,*puVar5);
      Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>(__return_storage_ptr__,&local_2d);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"expected i32",&local_71);
      ParseInput::err(&local_50,&pPVar2->in,&local_70);
      Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_50);
      WATParser::Err::~Err(&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
    }
    break;
  case i64:
    oVar9 = ParseInput::takeI64(&stack0xffffffffffffffe0->in);
    local_98._M_value =
         oVar9.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_payload;
    c_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value._0_1_ =
         oVar9.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
         _M_engaged;
    bVar3 = std::optional::operator_cast_to_bool((optional *)&local_98);
    pPVar2 = stack0xffffffffffffffe0;
    _Var1 = c.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
            _M_payload;
    if (bVar3) {
      puVar6 = (uint64_t *)std::optional<long>::operator*((optional<long> *)&local_98);
      NullInstrParserCtx::makeI64Const((NullInstrParserCtx *)pPVar2,_Var1._M_value,*puVar6);
      Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>(__return_storage_ptr__,&local_99);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &c_2.super__Optional_base<float,_true,_true>._M_payload.
                  super__Optional_payload_base<float>._M_engaged,"expected i64",
                 (allocator<char> *)
                 ((long)&c_2.super__Optional_base<float,_true,_true>._M_payload.
                         super__Optional_payload_base<float>._M_payload + 3));
      ParseInput::err(&local_c0,&pPVar2->in,
                      (string *)
                      &c_2.super__Optional_base<float,_true,_true>._M_payload.
                       super__Optional_payload_base<float>._M_engaged);
      Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_c0);
      WATParser::Err::~Err(&local_c0);
      std::__cxx11::string::~string
                ((string *)
                 &c_2.super__Optional_base<float,_true,_true>._M_payload.
                  super__Optional_payload_base<float>._M_engaged);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&c_2.super__Optional_base<float,_true,_true>._M_payload.
                         super__Optional_payload_base<float>._M_payload + 3));
    }
    break;
  case f32:
    local_ec = (_Optional_payload_base<float>)ParseInput::takeF32(&stack0xffffffffffffffe0->in);
    bVar3 = std::optional::operator_cast_to_bool((optional *)&local_ec);
    pPVar2 = stack0xffffffffffffffe0;
    _Var1 = c.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
            _M_payload;
    if (bVar3) {
      pfVar7 = std::optional<float>::operator*((optional<float> *)&local_ec);
      NullInstrParserCtx::makeF32Const((NullInstrParserCtx *)pPVar2,_Var1._M_value,*pfVar7);
      Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>(__return_storage_ptr__,&local_ed);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"expected f32",
                 (allocator<char> *)
                 &c_3.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>.field_0xf);
      ParseInput::err(&local_110,&pPVar2->in,&local_130);
      Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_110);
      WATParser::Err::~Err(&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 &c_3.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>.field_0xf);
    }
    break;
  case f64:
    oVar10 = ParseInput::takeF64(&stack0xffffffffffffffe0->in);
    local_148 = oVar10.super__Optional_base<double,_true,_true>._M_payload.
                super__Optional_payload_base<double>._M_payload;
    c_3.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _M_payload._0_1_ =
         oVar10.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>._M_engaged;
    bVar3 = std::optional::operator_cast_to_bool((optional *)&local_148);
    pPVar2 = stack0xffffffffffffffe0;
    _Var1 = c.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
            _M_payload;
    if (bVar3) {
      pdVar8 = std::optional<double>::operator*((optional<double> *)&local_148);
      NullInstrParserCtx::makeF64Const((NullInstrParserCtx *)pPVar2,_Var1._M_value,*pdVar8);
      Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>(__return_storage_ptr__,&local_149);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,"expected f64",&local_191);
      ParseInput::err(&local_170,&pPVar2->in,&local_190);
      Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_170);
      WATParser::Err::~Err(&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator(&local_191);
    }
    break;
  case v128:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"unimplemented instruction",&local_1d9);
    ParseInput::err(&local_1b8,&pPVar2->in,&local_1d8);
    Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_1b8);
    WATParser::Err::~Err(&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::InstrT> makeConst(Ctx& ctx, Index pos, Type type) {
  assert(type.isBasic());
  switch (type.getBasic()) {
    case Type::i32:
      if (auto c = ctx.in.takeI32()) {
        return ctx.makeI32Const(pos, *c);
      }
      return ctx.in.err("expected i32");
    case Type::i64:
      if (auto c = ctx.in.takeI64()) {
        return ctx.makeI64Const(pos, *c);
      }
      return ctx.in.err("expected i64");
    case Type::f32:
      if (auto c = ctx.in.takeF32()) {
        return ctx.makeF32Const(pos, *c);
      }
      return ctx.in.err("expected f32");
    case Type::f64:
      if (auto c = ctx.in.takeF64()) {
        return ctx.makeF64Const(pos, *c);
      }
      return ctx.in.err("expected f64");
    case Type::v128:
      return ctx.in.err("unimplemented instruction");
    case Type::none:
    case Type::unreachable:
      break;
  }
  WASM_UNREACHABLE("unexpected type");
}